

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateHeader(FileGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
  GenerateMacroUndefs(this,printer);
  GenerateForwardDeclarations(this,printer);
  GenerateNamespaceOpeners(this,printer);
  GenerateGlobalStateFunctionDeclarations(this,printer);
  io::Printer::Print(printer,"\n");
  GenerateEnumDefinitions(this,printer);
  io::Printer::Print(printer,
                     "// ===================================================================\n");
  io::Printer::Print(printer,"\n");
  GenerateMessageDefinitions(this,printer);
  io::Printer::Print(printer,"\n");
  io::Printer::Print(printer,
                     "// ===================================================================\n");
  io::Printer::Print(printer,"\n");
  GenerateServiceDefinitions(this,printer);
  GenerateExtensionIdentifiers(this,printer);
  io::Printer::Print(printer,"\n");
  io::Printer::Print(printer,
                     "// ===================================================================\n");
  io::Printer::Print(printer,"\n");
  GenerateInlineFunctionDefinitions(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n\n");
  GenerateNamespaceClosers(this,printer);
  GenerateProto2NamespaceEnumSpecializations(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n\n");
  return;
}

Assistant:

void FileGenerator::GenerateHeader(io::Printer* printer) {
  printer->Print(
    "// @@protoc_insertion_point(includes)\n");

  GenerateMacroUndefs(printer);

  GenerateForwardDeclarations(printer);

  // Open namespace.
  GenerateNamespaceOpeners(printer);

  GenerateGlobalStateFunctionDeclarations(printer);

  printer->Print("\n");

  GenerateEnumDefinitions(printer);

  printer->Print(kThickSeparator);
  printer->Print("\n");

  GenerateMessageDefinitions(printer);

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  GenerateServiceDefinitions(printer);

  GenerateExtensionIdentifiers(printer);

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  GenerateInlineFunctionDefinitions(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n"
    "\n");

  // Close up namespace.
  GenerateNamespaceClosers(printer);

  // We need to specialize some templates in the ::google::protobuf namespace:
  GenerateProto2NamespaceEnumSpecializations(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n"
    "\n");
}